

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::RefcountedClient::~RefcountedClient
          (RefcountedClient *this)

{
  NetworkAddressHttpClient *pNVar1;
  Disposer *pDVar2;
  PromiseArenaMember *node;
  _Map_pointer __src;
  _Map_pointer ppAVar3;
  ulong uVar4;
  int iVar5;
  undefined4 extraout_var;
  NetworkAddress *pNVar6;
  AvailableClient *pAVar7;
  size_t sVar8;
  long lVar9;
  _Map_pointer __dest;
  _Map_pointer ppAVar10;
  Disposer *pDVar11;
  _Elt_pointer pAVar12;
  long lVar13;
  HttpClientImpl *pHVar14;
  NullableValue<kj::Exception> _exception6045;
  NetworkAddressHttpClient local_520 [2];
  undefined1 local_360;
  
  pNVar1 = this->parent;
  pNVar1->activeConnectionCount = pNVar1->activeConnectionCount - 1;
  pDVar2 = (this->client).disposer;
  pHVar14 = (this->client).ptr;
  (this->client).ptr = (HttpClientImpl *)0x0;
  if (((((pHVar14->upgraded != false) || (pHVar14->closed != false)) ||
       ((pHVar14->httpInput).broken != false)) ||
      (((pHVar14->httpInput).pendingMessageCount != 0 || ((pHVar14->httpOutput).inBody != false))))
     || (((pHVar14->httpOutput).broken != false ||
         (((pHVar14->httpOutput).writeInProgress != false ||
          ((pNVar1->settings).idleTimeout.value < 1)))))) goto LAB_0042a8af;
  iVar5 = (**(pNVar1->timer->super_MonotonicClock)._vptr_MonotonicClock)();
  pNVar6 = (NetworkAddress *)(CONCAT44(extraout_var,iVar5) + (pNVar1->settings).idleTimeout.value);
  pAVar12 = (pNVar1->availableClients).
            super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar12 ==
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    ppAVar10 = (pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    __src = (pNVar1->availableClients).
            super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
    lVar9 = (long)ppAVar10 - (long)__src >> 3;
    local_520[0].address.ptr = pNVar6;
    if (((long)(pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
        ((long)pAVar12 -
         (long)(pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
        (lVar9 + -1 + (ulong)(ppAVar10 == (_Map_pointer)0x0)) * 0x15 == 0xaaaaaaaaaaaaaaa) {
      std::__throw_length_error("cannot create std::deque larger than max_size()");
    }
    ppAVar3 = (pNVar1->availableClients).
              super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
              ._M_impl.super__Deque_impl_data._M_map;
    uVar4 = (pNVar1->availableClients).
            super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
    if (uVar4 - ((long)ppAVar10 - (long)ppAVar3 >> 3) < 2) {
      pDVar11 = (Disposer *)(lVar9 + 1);
      if (lVar9 * 2 + 4U < uVar4) {
        __dest = (_Map_pointer)((long)ppAVar3 + (uVar4 - (lVar9 + 2) & 0xfffffffffffffffe) * 4);
        if (__dest < __src) {
          sVar8 = (long)ppAVar10 + (8 - (long)__src);
          ppAVar10 = __dest;
          if (sVar8 != 0) {
LAB_0042ac84:
            memmove(ppAVar10,__src,sVar8);
          }
        }
        else {
          sVar8 = (long)ppAVar10 + (8 - (long)__src);
          if (sVar8 != 0) {
            ppAVar10 = (_Map_pointer)((long)__dest + ((long)pDVar11 * 8 - sVar8));
            goto LAB_0042ac84;
          }
        }
      }
      else {
        lVar13 = uVar4 * 2 + (ulong)(uVar4 == 0);
        local_520[0].responseHeaderTable = (HttpHeaderTable *)(lVar13 + 2);
        local_520[0].address.disposer = pDVar11;
        if ((ulong)local_520[0].responseHeaderTable >> 0x3c != 0) {
          if ((ulong)local_520[0].responseHeaderTable >> 0x3d != 0) {
            std::__throw_bad_array_new_length();
          }
          std::__throw_bad_alloc();
        }
        local_520[0].timer = (Timer *)operator_new((long)local_520[0].responseHeaderTable * 8);
        __dest = (_Map_pointer)
                 ((long)&((local_520[0].timer)->super_MonotonicClock)._vptr_MonotonicClock +
                 (lVar13 - lVar9 & 0xfffffffffffffffeU) * 4);
        ppAVar10 = (pNVar1->availableClients).
                   super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        sVar8 = (long)(pNVar1->availableClients).
                      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node + (8 - (long)ppAVar10);
        if (sVar8 != 0) {
          memmove(__dest,ppAVar10,sVar8);
        }
        operator_delete((pNVar1->availableClients).
                        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                        ._M_impl.super__Deque_impl_data._M_map,
                        (pNVar1->availableClients).
                        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                        ._M_impl.super__Deque_impl_data._M_map_size << 3);
        (pNVar1->availableClients).
        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
        ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)local_520[0].timer;
        (pNVar1->availableClients).
        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
        ._M_impl.super__Deque_impl_data._M_map_size = (size_t)local_520[0].responseHeaderTable;
        pDVar11 = local_520[0].address.disposer;
      }
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = __dest;
      pAVar7 = *__dest;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = pAVar7;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last = pAVar7 + 0x15;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node =
           __dest + (long)((long)&pDVar11[-1]._vptr_Disposer + 7);
      pAVar7 = __dest[(long)((long)&pDVar11[-1]._vptr_Disposer + 7)];
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = pAVar7;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = pAVar7 + 0x15;
    }
    pAVar7 = (AvailableClient *)operator_new(0x1f8);
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pAVar7;
    pAVar12 = (pNVar1->availableClients).
              super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    (pAVar12->client).disposer = pDVar2;
    (pAVar12->client).ptr = pHVar14;
    (pAVar12->expires).value.value = (long)local_520[0].address.ptr;
    ppAVar10 = (pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = ppAVar10 + 1;
    pAVar12 = ppAVar10[1];
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = pAVar12;
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = pAVar12 + 0x15;
  }
  else {
    (pAVar12->client).disposer = pDVar2;
    (pAVar12->client).ptr = pHVar14;
    (pAVar12->expires).value.value = (long)pNVar6;
    pAVar12 = pAVar12 + 1;
  }
  (pNVar1->availableClients).
  super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = pAVar12;
  pHVar14 = (HttpClientImpl *)0x0;
LAB_0042a8af:
  if (pNVar1->timeoutsScheduled == false) {
    pNVar1->timeoutsScheduled = true;
    applyTimeouts(local_520);
    node = &((pNVar1->timeoutTask).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    (pNVar1->timeoutTask).super_PromiseBase.node.ptr =
         (PromiseNode *)local_520[0].super_HttpClient._vptr_HttpClient;
    local_520[0].super_HttpClient._vptr_HttpClient = (_func_int **)0x0;
    if (node != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose(node);
    }
  }
  if (pHVar14 != (HttpClientImpl *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pHVar14->super_HttpClient)._vptr_HttpClient +
                      (long)(pHVar14->super_HttpClient)._vptr_HttpClient[-2]));
  }
  local_360 = 0;
  local_520[0].settings.idleTimeout.value._0_1_ = 0;
  pHVar14 = (this->client).ptr;
  if (pHVar14 != (HttpClientImpl *)0x0) {
    (this->client).ptr = (HttpClientImpl *)0x0;
    pDVar2 = (this->client).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pHVar14->super_HttpClient)._vptr_HttpClient +
                      (long)(pHVar14->super_HttpClient)._vptr_HttpClient[-2]));
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~RefcountedClient() noexcept(false) {
      --parent.activeConnectionCount;
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
        parent.returnClientToAvailable(kj::mv(client));
      })) {
        KJ_LOG(ERROR, exception);
      }
    }